

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O0

bool flecs::_::pack_args_to_string<Position,Rocket>(world_t *world,stringstream *str,bool is_each)

{
  char *pcVar1;
  iterator ppcVar2;
  reference ppcVar3;
  value_type id;
  iterator __end0;
  iterator __begin0;
  array<const_char_*,_2UL> *__range2;
  size_t i;
  array<const_char_*,_2UL> optional_modifiers;
  array<const_char_*,_2UL> inout_modifiers;
  array<const_char_*,_2UL> ids;
  bool is_each_local;
  stringstream *str_local;
  world_t *world_local;
  
  inout_modifiers._M_elems[1] = component_info<Position>::name(world);
  component_info<Rocket>::name(world);
  optional_modifiers._M_elems[1] = "";
  inout_modifiers._M_elems[0] = "";
  i = (long)"%s here: (%i,%i) (matched via each())\n" + 0x26;
  optional_modifiers._M_elems[0] = "";
  __range2 = (array<const_char_*,_2UL> *)0x0;
  __end0 = std::array<const_char_*,_2UL>::begin
                     ((array<const_char_*,_2UL> *)(inout_modifiers._M_elems + 1));
  ppcVar2 = std::array<const_char_*,_2UL>::end
                      ((array<const_char_*,_2UL> *)(inout_modifiers._M_elems + 1));
  for (; __end0 != ppcVar2; __end0 = __end0 + 1) {
    pcVar1 = *__end0;
    if (__range2 != (array<const_char_*,_2UL> *)0x0) {
      std::operator<<((ostream *)(str + 0x10),",");
    }
    ppcVar3 = std::array<const_char_*,_2UL>::operator[]
                        ((array<const_char_*,_2UL> *)(optional_modifiers._M_elems + 1),
                         (size_type)__range2);
    std::operator<<((ostream *)(str + 0x10),*ppcVar3);
    ppcVar3 = std::array<const_char_*,_2UL>::operator[]
                        ((array<const_char_*,_2UL> *)&i,(size_type)__range2);
    std::operator<<((ostream *)(str + 0x10),*ppcVar3);
    if (is_each) {
      std::operator<<((ostream *)(str + 0x10),"ANY:");
    }
    std::operator<<((ostream *)(str + 0x10),pcVar1);
    __range2 = (array<const_char_*,_2UL> *)((long)__range2->_M_elems + 1);
  }
  return __range2 != (array<const_char_*,_2UL> *)0x0;
}

Assistant:

bool pack_args_to_string(world_t *world, std::stringstream& str, bool is_each) {
    (void)world;

    std::array<const char*, sizeof...(Components)> ids = {
        (_::component_info<Components>::name(world))...
    };

    std::array<const char*, sizeof...(Components)> inout_modifiers = {
        (inout_modifier<Components>())...
    }; 

    std::array<const char*, sizeof...(Components)> optional_modifiers = {
        (optional_modifier<Components>())...
    };        

    size_t i = 0;
    for (auto id : ids) {
        if (i) {
            str << ",";
        }
        
        str << inout_modifiers[i];
        str << optional_modifiers[i];

        if (is_each) {
            str << "ANY:";
        }
        str << id;
        i ++;
    }  

    return i != 0;
}